

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void __thiscall CHIP8::initialise(CHIP8 *this)

{
  time_t tVar1;
  int local_20;
  int local_1c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  CHIP8 *this_local;
  
  this->opcode = 0;
  this->I = 0;
  this->pc = 0x200;
  this->sp = 0;
  this->delayTimer = '\0';
  this->soundTimer = '\0';
  for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
    this->stack[i_2] = 0;
    this->R[i_2] = '\0';
    this->key[i_2] = '\0';
  }
  for (i_3 = 0; i_3 < 0x800; i_3 = i_3 + 1) {
    this->graphics[i_3] = '\0';
  }
  for (local_1c = 0; local_1c < 0x1000; local_1c = local_1c + 1) {
    this->memory[local_1c] = '\0';
  }
  for (local_20 = 0; local_20 < 0x50; local_20 = local_20 + 1) {
    this->memory[local_20] = CHIP8Fontset[local_20];
  }
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  return;
}

Assistant:

void CHIP8::initialise(){

    opcode     = 0;
    I          = 0;
    pc         = 0x200;
    sp         = 0;
    delayTimer = 0;
    soundTimer = 0;

    for (int i = 0; i < 16; ++i){
        stack[i] = 0;
        R[i]     = 0;
        key[i]   = 0;
    }

    for (int i = 0; i < 64 * 32; ++i){
        graphics[i] = 0;
    }

    for (int i = 0; i < 4096; ++i){
        memory[i] = 0;
    }

    for (int i = 0; i < 80; ++i){
        memory[i] = CHIP8Fontset[i];
    }

    srand(time(0));
}